

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache_p.h
# Opt level: O2

void __thiscall QNetworkDiskCachePrivate::~QNetworkDiskCachePrivate(QNetworkDiskCachePrivate *this)

{
  ~QNetworkDiskCachePrivate(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

QNetworkDiskCachePrivate()
        : QAbstractNetworkCachePrivate()
        , maximumCacheSize(1024 * 1024 * 50)
        , currentCacheSize(-1)
        {}